

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTestSeqSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  Fra_Ssw_t Pars;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  Pars.nPartSize = 0;
  Pars.nOverSize = 0;
  Pars.nFramesP = 0;
  Pars.nFramesK = 1;
  Pars.nMaxImps = 5000;
  Pars.nMaxLevs = 0;
  Pars.TimeLimit = 0.0;
  Pars.fUseImps = 0;
  local_ac = 0;
  Extra_UtilGetoptReset();
  local_c4 = Pars.nMaxLevs;
  local_c0 = Pars.nMaxImps;
  local_bc = Pars.nFramesK;
  local_b8 = Pars.nFramesP;
  local_b0 = Pars.nPartSize;
  local_b4 = Pars.nOverSize;
  local_34 = 1;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_5c = 0;
  local_4c = 0;
  local_50 = 0;
  local_48 = 0;
  local_58 = 0;
  local_54 = 0;
LAB_00238538:
  iVar1 = Extra_UtilGetopt(argc,argv,"PQNFILirfletvh");
  iVar3 = globalUtilOptind;
  switch(iVar1) {
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_bc = uVar2;
      local_34 = uVar2;
LAB_0023867a:
      globalUtilOptind = iVar3 + 1;
      if ((int)uVar2 < 1) goto switchD_00238564_caseD_67;
      goto LAB_00238538;
    }
    pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4f:
    goto switchD_00238564_caseD_67;
  case 0x49:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_c0 = uVar2;
      goto LAB_0023867a;
    }
    pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_c4 = uVar2;
      local_38 = uVar2;
      goto LAB_0023867a;
    }
    pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8 = uVar2;
      local_3c = uVar2;
LAB_002386af:
      globalUtilOptind = iVar3 + 1;
      if ((int)uVar2 < 0) goto switchD_00238564_caseD_67;
      goto LAB_00238538;
    }
    pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
      break;
    }
    local_b0 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    local_44 = local_b0;
    if ((int)local_b0 < 2) {
switchD_00238564_caseD_67:
      Pars.fUseImps = local_ac;
      Pars.nMaxLevs = local_c4;
      Pars.nMaxImps = local_c0;
      Pars.nFramesK = local_bc;
      Pars.nFramesP = local_b8;
      Pars.nOverSize = local_b4;
      Pars.nPartSize = local_b0;
LAB_0023895d:
      iVar3 = -2;
      Abc_Print(-2,"usage: testssw [-PQNFL num] [-lrfetvh] <file>\n");
      Abc_Print(-2,"\t         performs sequential sweep using K-step induction\n");
      Abc_Print(-2,"\t         (outputs a file with a set of pairs of equivalent nodes)\n");
      Abc_Print(-2,"\t-P num : max partition size (0 = no partitioning) [default = %d]\n",
                (ulong)local_44);
      Abc_Print(-2,"\t-Q num : partition overlap (0 = no overlap) [default = %d]\n",(ulong)local_40)
      ;
      Abc_Print(-2,"\t-N num : number of time frames to use as the prefix [default = %d]\n",
                (ulong)local_3c);
      Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
                (ulong)local_34);
      Abc_Print(-2,"\t-L num : max number of levels to consider (0=all) [default = %d]\n",
                (ulong)local_38);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_50 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle latch correspondence only [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_5c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle AIG rewriting [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_4c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n",pcVar4
               );
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle writing implications as assertions [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_58 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using one-hotness conditions [default = %s]\n",pcVar4);
      if (local_54 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_00238ac5:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
    goto LAB_00238538;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b4 = uVar2;
      local_40 = uVar2;
      goto LAB_002386af;
    }
    pcVar4 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  default:
    switch(iVar1) {
    case 0x65:
      local_48 = local_48 ^ 1;
      break;
    case 0x66:
      local_4c = local_4c ^ 1;
      break;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
      goto switchD_00238564_caseD_67;
    case 0x69:
      local_ac = local_ac ^ 1;
      break;
    case 0x6c:
      local_50 = local_50 ^ 1;
      break;
    default:
      if (iVar1 == 0x72) {
        local_5c = local_5c ^ 1;
      }
      else if (iVar1 == 0x74) {
        local_58 = local_58 ^ 1;
      }
      else {
        if (iVar1 != 0x76) {
          if (iVar1 == -1) {
            Pars.fUseImps = local_ac;
            Pars.nMaxLevs = local_c4;
            Pars.nMaxImps = local_c0;
            Pars.nFramesK = local_bc;
            Pars.nFramesP = local_b8;
            Pars.nOverSize = local_b4;
            Pars.nPartSize = local_b0;
            Pars.fVerbose = local_54;
            Pars.fUse1Hot = local_58;
            Pars.fWriteImps = local_48;
            Pars.fLatchCorr = local_50;
            Pars.fFraiging = local_4c;
            Pars.fRewrite = local_5c;
            if (globalUtilOptind + 1 == argc) {
              Fra_FraigInductionTest(argv[globalUtilOptind],&Pars);
              return 0;
            }
            pcVar4 = "File name should be given on the command line.\n";
            iVar3 = -1;
            goto LAB_00238ac5;
          }
          goto switchD_00238564_caseD_67;
        }
        local_54 = local_54 ^ 1;
      }
    }
    goto LAB_00238538;
  }
  Pars.nMaxLevs = local_c4;
  Pars.nMaxImps = local_c0;
  Pars.nFramesK = local_bc;
  Pars.nFramesP = local_b8;
  Pars.nOverSize = local_b4;
  Pars.nPartSize = local_b0;
  Pars.fUseImps = local_ac;
  Abc_Print(-1,pcVar4);
  goto LAB_0023895d;
}

Assistant:

int Abc_CommandTestSeqSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName;
    Fra_Ssw_t Pars, * pPars = &Pars;
    int c;
//    extern Abc_Ntk_t * Abc_NtkDarSeqSweep( Abc_Ntk_t * pNtk, Fra_Ssw_t * pPars );
    extern int Fra_FraigInductionTest( char * pFileName, Fra_Ssw_t * pParams );

    // set defaults
    pPars->nPartSize  = 0;
    pPars->nOverSize  = 0;
    pPars->nFramesP   = 0;
    pPars->nFramesK   = 1;
    pPars->nMaxImps   = 5000;
    pPars->nMaxLevs   = 0;
    pPars->fUseImps   = 0;
    pPars->fRewrite   = 0;
    pPars->fFraiging  = 0;
    pPars->fLatchCorr = 0;
    pPars->fWriteImps = 0;
    pPars->fUse1Hot   = 0;
    pPars->fVerbose   = 0;
    pPars->TimeLimit  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PQNFILirfletvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPartSize < 2 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOverSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOverSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesP = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesP < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK <= 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxImps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxImps <= 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxLevs <= 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseImps ^= 1;
            break;
        case 'r':
            pPars->fRewrite ^= 1;
            break;
        case 'f':
            pPars->fFraiging ^= 1;
            break;
        case 'l':
            pPars->fLatchCorr ^= 1;
            break;
        case 'e':
            pPars->fWriteImps ^= 1;
            break;
        case 't':
            pPars->fUse1Hot ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // get the input file name
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else
    {
        Abc_Print( -1, "File name should be given on the command line.\n" );
        return 1;
    }
    Fra_FraigInductionTest( pFileName, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: testssw [-PQNFL num] [-lrfetvh] <file>\n" );
    Abc_Print( -2, "\t         performs sequential sweep using K-step induction\n" );
    Abc_Print( -2, "\t         (outputs a file with a set of pairs of equivalent nodes)\n" );
    Abc_Print( -2, "\t-P num : max partition size (0 = no partitioning) [default = %d]\n", pPars->nPartSize );
    Abc_Print( -2, "\t-Q num : partition overlap (0 = no overlap) [default = %d]\n", pPars->nOverSize );
    Abc_Print( -2, "\t-N num : number of time frames to use as the prefix [default = %d]\n", pPars->nFramesP );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-L num : max number of levels to consider (0=all) [default = %d]\n", pPars->nMaxLevs );
//    Abc_Print( -2, "\t-I num : max number of implications to consider [default = %d]\n", pPars->nMaxImps );
//    Abc_Print( -2, "\t-i     : toggle using implications [default = %s]\n", pPars->fUseImps? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle latch correspondence only [default = %s]\n", pPars->fLatchCorr? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle AIG rewriting [default = %s]\n", pPars->fRewrite? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n", pPars->fFraiging? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle writing implications as assertions [default = %s]\n", pPars->fWriteImps? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using one-hotness conditions [default = %s]\n", pPars->fUse1Hot? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}